

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool cmExecProgramCommand::RunCommand
               (char *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  bool bVar1;
  char *__s;
  uint uVar2;
  int iVar3;
  cmsysProcess *cp;
  byte bVar4;
  cmProcessOutput processOutput;
  int length;
  char *cmd [4];
  char *data;
  string strdata;
  string commandInDir;
  string msg;
  cmProcessOutput local_10d;
  int local_10c;
  int *local_108;
  string *local_100;
  string local_f8;
  char *local_d8;
  string local_d0;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  bVar1 = cmSystemTools::s_DisableRunCommandOutput;
  local_108 = retVal;
  local_100 = output;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    cmSystemTools::Error("Error allocating process instance.",(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0023b857;
  }
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = '\0';
  if (dir == (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_b0);
  }
  else {
    std::__cxx11::string::assign((char *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
  }
  std::__cxx11::string::append((char *)&local_b0);
  __s = local_b0;
  bVar4 = ~bVar1 & verbose;
  if (bVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"running ",(allocator<char> *)&local_d0);
    cmSystemTools::Stdout(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,__s,(allocator<char> *)&local_d0);
    cmSystemTools::Stdout(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"\n",(allocator<char> *)&local_d0);
    cmSystemTools::Stdout(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  fflush(_stdout);
  fflush(_stderr);
  local_f8._M_dataplus._M_p = "/bin/sh";
  local_f8._M_string_length = 0x48caf1;
  local_f8.field_2._M_allocated_capacity = (size_type)__s;
  local_f8.field_2._8_8_ = 0;
  cmsysProcess_SetCommand(cp,(char **)&local_f8);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&local_10d,encoding,0x400);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  while (uVar2 = cmsysProcess_WaitForData(cp,&local_d8,&local_10c,(double *)0x0), uVar2 != 0) {
    if ((uVar2 & 0xfffffffe) == 2) {
      if (bVar4 != 0) {
        cmProcessOutput::DecodeText(&local_10d,local_d8,(long)local_10c,&local_d0,0);
        cmSystemTools::Stdout(&local_d0);
      }
      std::__cxx11::string::append((char *)local_100,(ulong)local_d8);
    }
  }
  if (bVar4 != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    cmProcessOutput::DecodeText(&local_10d,&local_50,&local_d0,0);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_d0._M_string_length != 0) {
      cmSystemTools::Stdout(&local_d0);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::__cxx11::string::string((string *)&local_70,(string *)local_100);
  cmProcessOutput::DecodeText(&local_10d,&local_70,local_100,0);
  std::__cxx11::string::~string((string *)&local_70);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    *local_108 = -1;
    std::__cxx11::string::append((char *)&local_90);
    cmsysProcess_GetErrorString(cp);
    goto LAB_0023b7d9;
  case 2:
    *local_108 = -1;
    std::__cxx11::string::append((char *)&local_90);
    cmsysProcess_GetExceptionString(cp);
LAB_0023b7d9:
    std::__cxx11::string::append((char *)&local_90);
    break;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
    *local_108 = iVar3;
    break;
  case 5:
    *local_108 = -1;
    std::__cxx11::string::append((char *)&local_90);
  }
  if (local_88 != 0) {
    std::__cxx11::string::append((string *)local_100);
  }
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  cmProcessOutput::~cmProcessOutput(&local_10d);
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0023b857:
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool cmExecProgramCommand::RunCommand(const char* command, std::string& output,
                                      int& retVal, const char* dir,
                                      bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  int count = 0;
  std::string shortCmd;
  if (command[0] == '\"') {
    // count the number of quotes
    for (const char* s = command; *s != 0; ++s) {
      if (*s == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd)) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd.c_str(), shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for " + cmd);
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd.c_str();
      } else {
        cmSystemTools::Error("Could not parse command line with quotes ",
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command, 0 };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = "cd \"";
    commandInDir += dir;
    commandInDir += "\" && ";
    commandInDir += command;
  } else {
    commandInDir = command;
  }
#  ifndef __VMS
  commandInDir += " 2>&1";
#  endif
  command = commandInDir.c_str();
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command, nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata);
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg);
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}